

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.cpp
# Opt level: O3

void __thiscall
btGeneric6DofConstraint::buildLinearJacobian
          (btGeneric6DofConstraint *this,btJacobianEntry *jacLinear,btVector3 *normalWorld,
          btVector3 *pivotAInW,btVector3 *pivotBInW)

{
  undefined8 uVar1;
  btRigidBody *pbVar2;
  btRigidBody *pbVar3;
  btVector3 local_80;
  btVector3 local_70;
  btMatrix3x3 local_60;
  btMatrix3x3 local_30;
  
  pbVar2 = (this->super_btTypedConstraint).m_rbA;
  local_30.m_el[0].m_floats[0] =
       (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0];
  local_30.m_el[0].m_floats[1] =
       (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0];
  local_30.m_el[0].m_floats[2] =
       (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0];
  local_30.m_el[0].m_floats[3] = 0.0;
  local_30.m_el[1].m_floats[0] =
       (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1];
  local_30.m_el[1].m_floats[1] =
       (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1];
  local_30.m_el[1].m_floats[2] =
       (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[1];
  local_30.m_el[1].m_floats[3] = 0.0;
  local_30.m_el[2].m_floats[0] =
       (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2];
  local_30.m_el[2].m_floats[1] =
       (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2];
  local_30.m_el[2].m_floats[2] =
       (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2];
  local_30.m_el[2].m_floats[3] = 0.0;
  pbVar3 = (this->super_btTypedConstraint).m_rbB;
  local_60.m_el[0].m_floats[0] =
       (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0];
  local_60.m_el[0].m_floats[1] =
       (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0];
  local_60.m_el[0].m_floats[2] =
       (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0];
  local_60.m_el[0].m_floats[3] = 0.0;
  local_60.m_el[1].m_floats[0] =
       (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1];
  local_60.m_el[1].m_floats[1] =
       (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1];
  local_60.m_el[1].m_floats[2] =
       (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[1];
  local_60.m_el[1].m_floats[3] = 0.0;
  local_60.m_el[2].m_floats[0] =
       (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2];
  local_60.m_el[2].m_floats[1] =
       (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2];
  local_60.m_el[2].m_floats[2] =
       (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2];
  local_60.m_el[2].m_floats[3] = 0.0;
  uVar1 = *(undefined8 *)(pbVar2->super_btCollisionObject).m_worldTransform.m_origin.m_floats;
  local_70.m_floats[1] =
       (float)((ulong)*(undefined8 *)pivotAInW->m_floats >> 0x20) - (float)((ulong)uVar1 >> 0x20);
  local_70.m_floats[0] = (float)*(undefined8 *)pivotAInW->m_floats - (float)uVar1;
  local_70.m_floats[2] =
       pivotAInW->m_floats[2] -
       (pbVar2->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2];
  local_70.m_floats[3] = 0.0;
  uVar1 = *(undefined8 *)(pbVar3->super_btCollisionObject).m_worldTransform.m_origin.m_floats;
  local_80.m_floats[1] =
       (float)((ulong)*(undefined8 *)pivotBInW->m_floats >> 0x20) - (float)((ulong)uVar1 >> 0x20);
  local_80.m_floats[0] = (float)*(undefined8 *)pivotBInW->m_floats - (float)uVar1;
  local_80.m_floats[2] =
       pivotBInW->m_floats[2] -
       (pbVar3->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2];
  local_80.m_floats[3] = 0.0;
  btJacobianEntry::btJacobianEntry
            (jacLinear,&local_30,&local_60,&local_70,&local_80,normalWorld,
             &pbVar2->m_invInertiaLocal,pbVar2->m_inverseMass,&pbVar3->m_invInertiaLocal,
             pbVar3->m_inverseMass);
  return;
}

Assistant:

void btGeneric6DofConstraint::buildLinearJacobian(
	btJacobianEntry & jacLinear,const btVector3 & normalWorld,
	const btVector3 & pivotAInW,const btVector3 & pivotBInW)
{
	new (&jacLinear) btJacobianEntry(
        m_rbA.getCenterOfMassTransform().getBasis().transpose(),
        m_rbB.getCenterOfMassTransform().getBasis().transpose(),
        pivotAInW - m_rbA.getCenterOfMassPosition(),
        pivotBInW - m_rbB.getCenterOfMassPosition(),
        normalWorld,
        m_rbA.getInvInertiaDiagLocal(),
        m_rbA.getInvMass(),
        m_rbB.getInvInertiaDiagLocal(),
        m_rbB.getInvMass());
}